

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O1

Block * __thiscall Sealer::Upchain(Block *__return_storage_ptr__,Sealer *this,Blockchain *bc)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t sVar3;
  string local_180;
  undefined1 local_160 [32];
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  int64_t local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  time_t local_d8;
  uint32_t local_d0;
  Block local_c8;
  
  sVar3 = Blockchain::GetBlockIndex(bc);
  pcVar1 = local_160 + 0x10;
  local_160._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,anon_var_dwarf_3a5ce + 0xc);
  pcVar2 = (this->merkle_root)._M_dataplus._M_p;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar2,pcVar2 + (this->merkle_root)._M_string_length);
  Block::Block(__return_storage_ptr__,(uint32_t)sVar3,(string *)local_160,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_160._0_8_ != pcVar1) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  Block::Block(&local_c8,__return_storage_ptr__);
  Blockchain::AddBlock((Block *)local_160,bc,&local_c8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_160);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_bHash,(string *)&local_140);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->merkle_root,(string *)&local_120);
  __return_storage_ptr__->_bNonce = local_100;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_bData,(string *)&local_f8);
  __return_storage_ptr__->_bIndex = local_d0;
  __return_storage_ptr__->_cTime = local_d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_p != &local_110) {
    operator_delete(local_120._M_p,local_110._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != &local_130) {
    operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
  }
  if ((pointer)local_160._0_8_ != pcVar1) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._bData._M_dataplus._M_p != &local_c8._bData.field_2) {
    operator_delete(local_c8._bData._M_dataplus._M_p,
                    local_c8._bData.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.merkle_root._M_dataplus._M_p != &local_c8.merkle_root.field_2) {
    operator_delete(local_c8.merkle_root._M_dataplus._M_p,
                    local_c8.merkle_root.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._bHash._M_dataplus._M_p != &local_c8._bHash.field_2) {
    operator_delete(local_c8._bHash._M_dataplus._M_p,
                    local_c8._bHash.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.bPrevHash._M_dataplus._M_p != &local_c8.bPrevHash.field_2) {
    operator_delete(local_c8.bPrevHash._M_dataplus._M_p,
                    local_c8.bPrevHash.field_2._M_allocated_capacity + 1);
  }
  Blockchain::BlockIndexAdd(bc);
  return __return_storage_ptr__;
}

Assistant:

Block Sealer::Upchain(Blockchain & bc) {
        Block bNew = Block(bc.GetBlockIndex(),"",merkle_root);
        bNew = bc.AddBlock(bNew);
        bc.BlockIndexAdd();
        return bNew;
}